

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O0

HTTP_CLIENT_RESULT uhttp_client_set_trusted_cert(HTTP_CLIENT_HANDLE handle,char *certificate)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  HTTP_CLIENT_RESULT result;
  char *certificate_local;
  HTTP_CLIENT_HANDLE handle_local;
  
  if ((handle == (HTTP_CLIENT_HANDLE)0x0) || (certificate == (char *)0x0)) {
    l._4_4_ = HTTP_CLIENT_INVALID_ARG;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                ,"uhttp_client_set_trusted_cert",0x605,1,
                "invalid parameter handle: %p certificate: %p",handle,certificate);
    }
  }
  else if ((handle->recv_msg).recv_state == state_initial) {
    iVar1 = mallocAndStrcpy_s(&handle->certificate,certificate);
    if (iVar1 == 0) {
      l._4_4_ = HTTP_CLIENT_OK;
    }
    else {
      l._4_4_ = HTTP_CLIENT_ERROR;
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                  ,"uhttp_client_set_trusted_cert",0x611,1,"failure allocating certificate");
      }
    }
  }
  else {
    l._4_4_ = HTTP_CLIENT_INVALID_STATE;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                ,"uhttp_client_set_trusted_cert",0x60a,1,
                "You must set the certificates before opening the connection");
    }
  }
  return l._4_4_;
}

Assistant:

HTTP_CLIENT_RESULT uhttp_client_set_trusted_cert(HTTP_CLIENT_HANDLE handle, const char* certificate)
{
    HTTP_CLIENT_RESULT result;
    if (handle == NULL || certificate == NULL)
    {
        /* Codes_SRS_UHTTP_07_038: [If handle is NULL then http_client_set_trace shall return HTTP_CLIENT_INVALID_ARG] */
        result = HTTP_CLIENT_INVALID_ARG;
        LogError("invalid parameter handle: %p certificate: %p", handle, certificate);
    }
    else if (handle->recv_msg.recv_state != state_initial)
    {
        result = HTTP_CLIENT_INVALID_STATE;
        LogError("You must set the certificates before opening the connection");
    }
    else
    {
        if (mallocAndStrcpy_s(&handle->certificate, certificate) != 0)
        {
            result = HTTP_CLIENT_ERROR;
            LogError("failure allocating certificate");
        }
        else
        {
            result = HTTP_CLIENT_OK;
        }
    }
    return result;
}